

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O0

REF_STATUS ref_recon_abs_value_hessian2(REF_GRID ref_grid,REF_DBL *hessian)

{
  uint uVar1;
  REF_DBL local_78;
  double local_70;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT node;
  REF_DBL diag_system [6];
  REF_NODE ref_node;
  REF_DBL *hessian_local;
  REF_GRID ref_grid_local;
  
  diag_system[5] = (REF_DBL)ref_grid->node;
  ref_private_macro_code_rss_1 = 0;
  do {
    if (*(int *)((long)diag_system[5] + 4) <= ref_private_macro_code_rss_1) {
      ref_grid_local._4_4_ = ref_node_ghost_dbl((REF_NODE)diag_system[5],hessian,3);
      if (ref_grid_local._4_4_ == 0) {
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x65f,"ref_recon_abs_value_hessian2",(ulong)ref_grid_local._4_4_,"update ghosts");
      }
      return ref_grid_local._4_4_;
    }
    if ((((-1 < ref_private_macro_code_rss_1) &&
         (ref_private_macro_code_rss_1 < *(int *)((long)diag_system[5] + 4))) &&
        (-1 < *(long *)(*(long *)((long)diag_system[5] + 0x10) +
                       (long)ref_private_macro_code_rss_1 * 8))) &&
       (*(int *)(*(long *)((long)diag_system[5] + 0x50) + 4) ==
        *(int *)(*(long *)((long)diag_system[5] + 0x28) + (long)ref_private_macro_code_rss_1 * 4)))
    {
      uVar1 = ref_matrix_diag_m2(hessian + ref_private_macro_code_rss_1 * 3,
                                 (REF_DBL *)&ref_private_macro_code_rss);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x658,"ref_recon_abs_value_hessian2",(ulong)uVar1,"decomp");
        return uVar1;
      }
      if (_ref_private_macro_code_rss <= 0.0) {
        local_70 = -_ref_private_macro_code_rss;
      }
      else {
        local_70 = _ref_private_macro_code_rss;
      }
      _ref_private_macro_code_rss = local_70;
      if (diag_system[0] <= 0.0) {
        local_78 = -diag_system[0];
      }
      else {
        local_78 = diag_system[0];
      }
      diag_system[0] = local_78;
      uVar1 = ref_matrix_form_m2((REF_DBL *)&ref_private_macro_code_rss,
                                 hessian + ref_private_macro_code_rss_1 * 3);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x65b,"ref_recon_abs_value_hessian2",(ulong)uVar1,"re-form");
        return uVar1;
      }
    }
    ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_recon_abs_value_hessian2(REF_GRID ref_grid,
                                                       REF_DBL *hessian) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL diag_system[6];
  REF_INT node;

  /* positive eigenvalues to make positive definite */
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      RSS(ref_matrix_diag_m2(&(hessian[3 * node]), diag_system), "decomp");
      ref_matrix_eig2(diag_system, 0) = ABS(ref_matrix_eig2(diag_system, 0));
      ref_matrix_eig2(diag_system, 1) = ABS(ref_matrix_eig2(diag_system, 1));
      RSS(ref_matrix_form_m2(diag_system, &(hessian[3 * node])), "re-form");
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, hessian, 3), "update ghosts");

  return REF_SUCCESS;
}